

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# areas.cpp
# Opt level: O0

bool __thiscall Area::allowsRandomPositionType(Area *this,ERandomPositionType type)

{
  ERandomPositionType type_local;
  Area *this_local;
  
  if (type == ForMonster) {
    this_local._7_1_ = (this->flags & 1U) == 0;
  }
  else if (type == ForItem) {
    this_local._7_1_ = (this->flags & 2U) == 0;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Area::allowsRandomPositionType(ERandomPositionType type)
{
    switch(type)
    {
    case ForMonster:
        return !(flags & NoMonsters);
    case ForItem:
        return !(flags & NoItems);
    default:
        return true;
    }
}